

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::setupViewports
          (ViewportIndexSubroutine *this,TEST_TYPE param_1,GLuint iteration_index)

{
  RenderContext *pRVar1;
  char *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 in_register_00000034;
  GLfloat data [8];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  long lVar5;
  
  pRVar1 = ((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_renderCtx;
  iVar3 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,param_1));
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_38 = 0x42800000;
  uStack_30 = 0x4300000042800000;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0x42800000;
  uStack_3c = 0x43000000;
  (**(code **)(lVar5 + 0x1a00))(0,0,0x80,0x80);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0xee4);
  if (iteration_index == 2) {
    (**(code **)(lVar5 + 0x1a18))(4,&local_48);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"ViewportIndexedfv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xefc);
    (**(code **)(lVar5 + 0x1a18))(5,&local_38);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    pcVar2 = "glViewportIndexedfv";
    iVar3 = 0xeff;
  }
  else {
    if (iteration_index == 1) {
      (**(code **)(lVar5 + 0x1a10))(0,0,0x42800000,0x43000000,4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"ViewportIndexedf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xef2);
      (**(code **)(lVar5 + 0x1a10))(0x42800000,0,0x42800000,0x43000000,5);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"ViewportIndexedf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xef5);
      return;
    }
    if (iteration_index != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xf04);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar5 + 0x1a08))(4,2,&local_48);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    pcVar2 = "glViewportArrayv";
    iVar3 = 0xeeb;
  }
  glu::checkError(dVar4,pcVar2 + 2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,iVar3);
  return;
}

Assistant:

void ViewportIndexSubroutine::setupViewports(TEST_TYPE /* type */, glw::GLuint iteration_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLfloat data[2 * 4] = { 0.0f, 0.0f, 64.0f, 128.0f, 64.0f, 0.0f, 64.0f, 128.0f };

	gl.viewport(0, 0, m_width, m_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

	switch (iteration_index)
	{
	case 0:

		gl.viewportArrayv(4, 2, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportArrayv");

		break;

	case 1:

		gl.viewportIndexedf(4, data[0], data[1], data[2], data[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedf");

		gl.viewportIndexedf(5, data[4], data[5], data[6], data[7]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedf");

		break;

	case 2:

		gl.viewportIndexedfv(4, &data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedfv");

		gl.viewportIndexedfv(5, &data[4]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedfv");

		break;

	default:
		TCU_FAIL("Invalid value");
	}
}